

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O0

void __thiscall QUnifiedTimer::uninstallAnimationDriver(QUnifiedTimer *this,QAnimationDriver *d)

{
  bool bVar1;
  QUnifiedTimer *in_RSI;
  QUnifiedTimer *in_RDI;
  long in_FS_OFFSET;
  bool running;
  int in_stack_ffffffffffffffc4;
  uint uVar2;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((QUnifiedTimer *)in_RDI->driver == in_RSI) {
    bVar1 = QAnimationDriver::isRunning((QAnimationDriver *)0x6695c9);
    uVar2 = (uint)bVar1 << 0x18;
    if (bVar1) {
      stopAnimationDriver(in_RSI);
    }
    in_RDI->driver = &(in_RDI->defaultDriver).super_QAnimationDriver;
    in_RDI->allowNegativeDelta = false;
    if ((uVar2 & 0x1000000) != 0) {
      startAnimationDriver(in_RDI);
    }
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_RDI,(char *)in_RSI,in_stack_ffffffffffffffc4,(char *)in_RDI);
    QMessageLogger::warning
              (&local_28,"QUnifiedTimer: trying to uninstall a driver that is not installed...");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUnifiedTimer::uninstallAnimationDriver(QAnimationDriver *d)
{
    if (driver != d) {
        qWarning("QUnifiedTimer: trying to uninstall a driver that is not installed...");
        return;
    }

    bool running = driver->isRunning();
    if (running)
        stopAnimationDriver();
    driver = &defaultDriver;
    allowNegativeDelta = false;
    if (running)
        startAnimationDriver();
}